

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateTabFocus(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool local_11;
  undefined8 in_stack_fffffffffffffff0;
  
  pIVar2 = GImGui;
  local_11 = false;
  if ((((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
       (local_11 = false, (GImGui->NavWindow->Active & 1U) != 0)) &&
      (local_11 = false, (GImGui->NavWindow->Flags & 0x40000U) == 0)) &&
     (local_11 = false, ((GImGui->IO).KeyCtrl & 1U) == 0)) {
    local_11 = IsKeyPressedMap((ImGuiKey)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffffff0 >> 0x18,0));
  }
  pIVar2->FocusTabPressed = local_11;
  if ((pIVar2->ActiveId == 0) && ((pIVar2->FocusTabPressed & 1U) != 0)) {
    pIVar2->FocusRequestNextWindow = pIVar2->NavWindow;
    pIVar2->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar2->NavId == 0) || (pIVar2->NavIdTabCounter == 0x7fffffff)) {
      iVar3 = 0;
      if (((pIVar2->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      pIVar2->FocusRequestNextCounterTabStop = iVar3;
    }
    else {
      iVar3 = 1;
      if (((pIVar2->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      pIVar2->FocusRequestNextCounterTabStop = pIVar2->NavIdTabCounter + 1 + iVar3;
    }
  }
  pIVar2->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar2->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar2->FocusRequestCurrCounterRegular = 0x7fffffff;
  if (pIVar2->FocusRequestNextWindow != (ImGuiWindow *)0x0) {
    pIVar1 = pIVar2->FocusRequestNextWindow;
    pIVar2->FocusRequestCurrWindow = pIVar1;
    if ((pIVar2->FocusRequestNextCounterRegular != 0x7fffffff) &&
       ((pIVar1->DC).FocusCounterRegular != -1)) {
      iVar3 = ImModPositive(pIVar2->FocusRequestNextCounterRegular,
                            (pIVar1->DC).FocusCounterRegular + 1);
      pIVar2->FocusRequestCurrCounterRegular = iVar3;
    }
    if ((pIVar2->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       ((pIVar1->DC).FocusCounterTabStop != -1)) {
      iVar3 = ImModPositive(pIVar2->FocusRequestNextCounterTabStop,
                            (pIVar1->DC).FocusCounterTabStop + 1);
      pIVar2->FocusRequestCurrCounterTabStop = iVar3;
    }
    pIVar2->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar2->FocusRequestNextCounterTabStop = 0x7fffffff;
    pIVar2->FocusRequestNextCounterRegular = 0x7fffffff;
  }
  pIVar2->NavIdTabCounter = 0x7fffffff;
  return;
}

Assistant:

void ImGui::UpdateTabFocus()
{
    ImGuiContext& g = *GImGui;

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterRegular = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTabStop = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTabStop = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterRegular = g.FocusRequestCurrCounterTabStop = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterRegular != INT_MAX && window->DC.FocusCounterRegular != -1)
            g.FocusRequestCurrCounterRegular = ImModPositive(g.FocusRequestNextCounterRegular, window->DC.FocusCounterRegular + 1);
        if (g.FocusRequestNextCounterTabStop != INT_MAX && window->DC.FocusCounterTabStop != -1)
            g.FocusRequestCurrCounterTabStop = ImModPositive(g.FocusRequestNextCounterTabStop, window->DC.FocusCounterTabStop + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterRegular = g.FocusRequestNextCounterTabStop = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;
}